

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

void __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
::setFromSignUnbiasedExponentAndNormalizedSignificand
          (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
           *this,bool negative,int_type exponent,uint_type significand,bool round_denorm_up)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = (ulong)(significand >> 1 | 0x400000);
  iVar2 = exponent;
  if (-0x7f < exponent) {
    uVar1 = (ulong)significand;
  }
  for (; iVar2 < -0x7f; iVar2 = iVar2 + 1) {
    uVar1 = uVar1 >> 1;
  }
  iVar2 = -0x7f;
  if (-0x7f < exponent) {
    iVar2 = exponent;
  }
  if ((int)(iVar2 + 0x7fU) < 0) {
    __assert_fail("exponent >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/hex_float.h"
                  ,0x1c9,
                  "void spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>>::setFromSignUnbiasedExponentAndNormalizedSignificand(bool, int_type, uint_type, bool) [T = spvtools::utils::FloatProxy<float>, Traits = spvtools::utils::HexFloatTraits<FloatProxy<float>>]"
                 );
  }
  uVar4 = (ulong)round_denorm_up;
  if ((uint)uVar1 != 0) {
    uVar4 = uVar1;
  }
  uVar3 = (uint)uVar4;
  if (-0x7f < exponent) {
    uVar3 = (uint)uVar1;
  }
  (this->value_).data_ = uVar3 & 0x7fffff | (iVar2 + 0x7fU & 0xff) << 0x17 | (uint)negative << 0x1f;
  return;
}

Assistant:

void setFromSignUnbiasedExponentAndNormalizedSignificand(
      bool negative, int_type exponent, uint_type significand,
      bool round_denorm_up) {
    bool significand_is_zero = significand == 0;

    if (exponent <= min_exponent) {
      // If this was denormalized, then we have to shift the bit on, meaning
      // the significand is not zero.
      significand_is_zero = false;
      significand |= first_exponent_bit;
      significand = static_cast<uint_type>(significand >> 1);
    }

    while (exponent < min_exponent) {
      significand = static_cast<uint_type>(significand >> 1);
      ++exponent;
    }

    if (exponent == min_exponent) {
      if (significand == 0 && !significand_is_zero && round_denorm_up) {
        significand = static_cast<uint_type>(0x1);
      }
    }

    uint_type new_value = 0;
    if (negative) {
      new_value = static_cast<uint_type>(new_value | sign_mask);
    }
    exponent = static_cast<int_type>(exponent + exponent_bias);
    assert(exponent >= 0);

    // put it all together
    exponent = static_cast<uint_type>((exponent << exponent_left_shift) &
                                      exponent_mask);
    significand = static_cast<uint_type>(significand & fraction_encode_mask);
    new_value = static_cast<uint_type>(new_value | (exponent | significand));
    value_ = T(new_value);
  }